

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

type __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::operator()
          (arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>
           *this,double value)

{
  undefined8 *puVar1;
  iterator iVar2;
  basic_format_specs<wchar_t> local_34;
  double local_20;
  double value_local;
  arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
  *this_local;
  
  local_20 = value;
  value_local = (double)this;
  if (*(long *)(this + 0x10) == 0) {
    basic_format_specs<wchar_t>::basic_format_specs(&local_34);
  }
  else {
    puVar1 = *(undefined8 **)(this + 0x10);
    local_34.super_align_spec._0_8_ = *puVar1;
    local_34._8_8_ = puVar1[1];
    local_34.super_core_format_specs._4_2_ = *(undefined2 *)(puVar1 + 2);
  }
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
  write_double<double>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_> *
             )this,value,&local_34);
  iVar2 = arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
          ::out((arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
                 *)this);
  return (type)iVar2.container;
}

Assistant:

typename std::enable_if<std::is_floating_point<T>::value, iterator>::type
      operator()(T value) {
    writer_.write_double(value, specs_ ? *specs_ : format_specs());
    return out();
  }